

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_xlat.cpp
# Opt level: O1

void P_TranslateLineDef(line_t *ld,maplinedef_t *mld,int lineindexforid)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  FBoomArg *pFVar4;
  bool bVar5;
  bool bVar6;
  int k;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  FLineTrans *pFVar13;
  FBoomArg *pFVar14;
  long lVar15;
  ulong uVar16;
  int tag;
  byte bVar17;
  FBoomArg *pFVar18;
  FXlatExprState *pFVar19;
  int *piVar20;
  long lVar21;
  FXlatExprState state;
  FXlatExprState local_4c;
  ulong local_40;
  int *local_38;
  
  uVar3 = mld->special;
  tag = (int)mld->tag;
  uVar10 = (uint)mld->flags;
  lVar15 = 0;
  do {
    if (((mld->flags >> ((uint)lVar15 & 0x1f) & 1) != 0) &&
       (LineFlagTranslations[lVar15].ismask == true)) {
      uVar10 = uVar10 & LineFlagTranslations[lVar15].newvalue;
    }
    lVar15 = lVar15 + 1;
  } while (lVar15 != 0x10);
  lVar15 = 0;
  bVar6 = false;
  uVar7 = 0;
  do {
    if (((uVar10 >> ((uint)lVar15 & 0x1f) & 1) != 0) &&
       (LineFlagTranslations[lVar15].ismask == false)) {
      uVar11 = LineFlagTranslations[lVar15].newvalue;
      if (uVar11 == 0xfffffffd) {
        ld->alpha = 0.25;
      }
      else if (uVar11 == 0xffffffff) {
        bVar6 = true;
      }
      else if (uVar11 == 0xfffffffe) {
        ld->alpha = 0.75;
      }
      else {
        uVar7 = uVar7 | uVar11;
      }
    }
    lVar15 = lVar15 + 1;
  } while (lVar15 != 0x10);
  if (-1 < lineindexforid) {
    FTagManager::AddLineID(&tagManager,lineindexforid,tag);
  }
  if (uVar3 == 0) {
    ld->special = 0;
    ld->flags = uVar7;
    ld->args[0] = (int)mld->tag;
    ld->args[1] = 0;
    ld->args[2] = 0;
    ld->args[3] = 0;
    ld->args[4] = 0;
  }
  else {
    uVar10 = (uint)uVar3;
    if (uVar10 < SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>.Count) {
      pFVar13 = SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>.Array + uVar3;
      if (pFVar13->special != 0) {
        ld->special = pFVar13->special;
        uVar7 = (pFVar13->flags & 0x20U) << 0x12 | (pFVar13->flags & 0x1fU) << 9 | uVar7;
        uVar11 = uVar7 >> 10 & 7;
        ld->flags = uVar7;
        ld->activation = 1 << (sbyte)uVar11;
        if ((uVar11 | 4) == 7) {
          ld->activation = 0x28;
        }
        ld->flags = uVar7 & 0xffffe3ff;
        if ((bVar6) && (ld->activation == 2)) {
          ld->activation = 0x40;
        }
        piVar20 = ld->args;
        lVar15 = 0;
        iVar8 = pFVar13->args[0];
        local_4c.linetype = uVar10;
        local_4c.tag = tag;
        switch(pFVar13->flags >> 0x14 & 3) {
        case 1:
          goto switchD_0046eee8_caseD_1;
        case 2:
          goto switchD_0046eee8_caseD_2;
        case 3:
switchD_0046eee8_caseD_3:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_xlat.cpp"
                        ,0xaa,"void P_TranslateLineDef(line_t *, maplinedef_t *, int)");
        }
switchD_0046eee8_caseD_0:
        *piVar20 = iVar8;
        lVar21 = lVar15;
        do {
          lVar15 = lVar21 + 2;
          if (lVar15 == 10) {
            if ((ld->flags & 0x20) == 0) {
              return;
            }
            if ((ld->activation & 0x42) == 0) {
              return;
            }
            ld->flags = ld->flags & 0xffffdfff;
            return;
          }
          piVar20 = piVar20 + 1;
          iVar8 = *(int *)((long)pFVar13->args + lVar21 * 2 + 4);
          switch(pFVar13->flags >> ((char)lVar21 + 0x16U & 0x1f) & 3) {
          case 0:
            goto switchD_0046eee8_caseD_0;
          case 1:
switchD_0046eee8_caseD_1:
            *piVar20 = tag;
            lVar21 = lVar15;
            break;
          case 2:
switchD_0046eee8_caseD_2:
            local_4c.bIsConstant = true;
            (*XlatExprEval[XlatExpressions.Array[iVar8]])
                      (piVar20,XlatExpressions.Array + iVar8,&local_4c);
            lVar21 = lVar15;
            break;
          case 3:
            goto switchD_0046eee8_caseD_3;
          }
        } while( true );
      }
    }
    bVar5 = 0 < NumBoomish;
    if (0 < NumBoomish) {
      piVar20 = ld->args;
      local_38 = ld->args + 1;
      lVar15 = 0;
      local_40 = (ulong)(uVar3 & 7);
      do {
        bVar12 = true;
        if ((Boomish[lVar15].FirstLinetype <= uVar3) && (uVar3 <= Boomish[lVar15].LastLinetype)) {
          bVar1 = Boomish[lVar15].NewSpecial;
          ld->special = (uint)bVar1;
          switch((long)&switchD_0046ef7c::switchdataD_0060c320 +
                 (long)(int)(&switchD_0046ef7c::switchdataD_0060c320)[local_40]) {
          case 0x46ef7e:
            uVar7 = uVar7 | 0x200;
          case 0x46ef85:
            if (bVar6) {
              ld->activation = 0x40;
            }
            else {
              ld->activation = 2;
            }
            break;
          case 0x46ef9b:
            uVar7 = uVar7 | 0x200;
          case 0x46efa2:
            ld->activation = 8;
            break;
          case 0x46efab:
            uVar7 = uVar7 | 0x200;
          case 0x46efb2:
            ld->activation = 1;
          }
          *piVar20 = tag;
          local_38[0] = 0;
          local_38[1] = 0;
          local_38[2] = 0;
          local_38[3] = 0;
          if (Boomish[lVar15].Args.Count != 0) {
            pFVar4 = Boomish[lVar15].Args.Array;
            uVar16 = 0;
            pFVar14 = pFVar4;
            do {
              bVar2 = pFVar4[uVar16].ArgNum;
              if ((ulong)bVar2 < 4) {
                pFVar19 = (FXlatExprState *)(piVar20 + (ulong)bVar2 + 1);
              }
              else {
                local_4c.linetype = uVar7 >> 9 & 0x3f;
                pFVar19 = &local_4c;
              }
              pFVar18 = pFVar4 + uVar16;
              if ((ulong)pFVar18->ListSize == 0) {
                bVar17 = pFVar18->ConstantValue;
                bVar12 = true;
              }
              else {
                uVar9 = 0;
                bVar12 = false;
                bVar17 = 0;
                do {
                  if ((pFVar18->AndValue & uVar3) == pFVar14->ResultFilter[uVar9]) {
                    bVar17 = pFVar14->ResultValue[uVar9];
                    bVar12 = true;
                  }
                  uVar9 = uVar9 + 1;
                } while (pFVar18->ListSize != uVar9);
              }
              if (bVar12) {
                uVar10 = (uint)bVar17;
                if (pFVar18->bOrExisting == true) {
                  uVar10 = (uint)bVar17 | pFVar19->linetype;
                }
                pFVar19->linetype = uVar10;
                if (bVar2 == 4) {
                  uVar7 = uVar7 & 0xffff81ff | local_4c.linetype << 9;
                }
              }
              uVar16 = uVar16 + 1;
              pFVar14 = pFVar14 + 1;
            } while (uVar16 < Boomish[lVar15].Args.Count);
          }
          if ((uVar3 & 6) == 6) {
            if (bVar1 == 0xca) {
              *(byte *)(ld->args + 2) = (byte)ld->args[2] | 0x80;
            }
            else {
              *piVar20 = 0;
            }
          }
          ld->flags = uVar7;
          if (((uVar7 >> 0xd & 1) != 0) && (ld->activation == 1)) {
            ld->activation = 0x80;
          }
          bVar12 = false;
        }
        if (!bVar12) break;
        lVar15 = lVar15 + 1;
        bVar5 = lVar15 < NumBoomish;
      } while (lVar15 < NumBoomish);
    }
    if (!bVar5) {
      ld->special = 0;
      ld->flags = uVar7;
      ld->args[0] = 0;
      ld->args[1] = 0;
      ld->args[2] = 0;
      ld->args[3] = 0;
      ld->args[4] = 0;
    }
  }
  return;
}

Assistant:

void P_TranslateLineDef (line_t *ld, maplinedef_t *mld, int lineindexforid)
{
	unsigned short special = (unsigned short) LittleShort(mld->special);
	short tag = LittleShort(mld->tag);
	DWORD flags = LittleShort(mld->flags);
	INTBOOL passthrough = 0;

	DWORD flags1 = flags;
	DWORD newflags = 0;

	for(int i=0;i<16;i++)
	{
		if ((flags & (1<<i)) && LineFlagTranslations[i].ismask)
		{
			flags1 &= LineFlagTranslations[i].newvalue;
		}
	}
	for(int i=0;i<16;i++)
	{
		if ((flags1 & (1<<i)) && !LineFlagTranslations[i].ismask)
		{
			switch (LineFlagTranslations[i].newvalue)
			{
			case -1:
				passthrough = true;
				break;
			case -2:
				ld->alpha = 0.75;
				break;
			case -3:
				ld->alpha = 0.25;
				break;
			default:
				newflags |= LineFlagTranslations[i].newvalue;
				break;
			}
		}
	}
	flags = newflags;

	if (lineindexforid >= 0)
	{
		// For purposes of maintaining BOOM compatibility, each
		// line also needs to have its ID set to the same as its tag.
		// An external conversion program would need to do this more
		// intelligently.
		tagManager.AddLineID(lineindexforid, tag);
	}

	// 0 specials are never translated.
	if (special == 0)
	{
		ld->special = 0;
		ld->flags = flags;
		ld->args[0] = mld->tag;
		memset (ld->args+1, 0, sizeof(ld->args)-sizeof(ld->args[0]));
		return;
	}

	FLineTrans *linetrans = NULL;
	if (special < SimpleLineTranslations.Size()) linetrans = &SimpleLineTranslations[special];
	if (linetrans != NULL && linetrans->special != 0)
	{
		ld->special = linetrans->special;

		ld->flags = flags | ((linetrans->flags & 0x1f) << 9);
		if (linetrans->flags & 0x20) ld->flags |= ML_FIRSTSIDEONLY;
		ld->activation = 1 << GET_SPAC(ld->flags);
		if (ld->activation == SPAC_AnyCross)
		{ // this is really PTouch
			ld->activation = SPAC_Impact|SPAC_PCross;
		}
		else if (ld->activation == SPAC_Impact)
		{ // In non-UMDF maps, Impact implies PCross
			ld->activation = SPAC_Impact | SPAC_PCross;
		}
		ld->flags &= ~ML_SPAC_MASK;

		if (passthrough && ld->activation == SPAC_Use)
		{
			ld->activation = SPAC_UseThrough;
		}
		// Set special arguments.
		FXlatExprState state;
		state.tag = tag;
		state.linetype = special;
		for (int t = 0; t < LINETRANS_MAXARGS; ++t)
		{
			int arg = linetrans->args[t];
			int argop = (linetrans->flags >> (LINETRANS_TAGSHIFT + t*TAGOP_NUMBITS)) & TAGOP_MASK;

			switch (argop)
			{
			case ARGOP_Const:
				ld->args[t] = arg;
				break;
			case ARGOP_Tag:
				ld->args[t] = tag;
				break;
			case ARGOP_Expr:
				{
					int *xnode = &XlatExpressions[arg];
					state.bIsConstant = true;
					XlatExprEval[*xnode](&ld->args[t], xnode, &state);
				}
				break;
			default:
				assert(0);
				ld->args[t] = 0;
				break;
			}
		}

		if ((ld->flags & ML_SECRET) && ld->activation & (SPAC_Use|SPAC_UseThrough))
		{
			ld->flags &= ~ML_MONSTERSCANACTIVATE;
		}
		return;
	}

	for(int i=0;i<NumBoomish;i++)
	{
		FBoomTranslator *b = &Boomish[i];

		if (special >= b->FirstLinetype && special <= b->LastLinetype)
		{
			ld->special = b->NewSpecial;

			switch (special & 0x0007)
			{
			case WalkMany:
				flags |= ML_REPEAT_SPECIAL;
			case WalkOnce:
				ld->activation = SPAC_Cross;
				break;

			case SwitchMany:
			case PushMany:
				flags |= ML_REPEAT_SPECIAL;
			case SwitchOnce:
			case PushOnce:
				if (passthrough)
					ld->activation = SPAC_UseThrough;
				else
					ld->activation = SPAC_Use;
				break;

			case GunMany:
				flags |= ML_REPEAT_SPECIAL;
			case GunOnce:
				ld->activation = SPAC_Impact;
				break;
			}

			ld->args[0] = tag;
			ld->args[1] = ld->args[2] = ld->args[3] = ld->args[4] = 0;

			for(unsigned j=0; j < b->Args.Size(); j++)
			{
				FBoomArg *arg = &b->Args[j];
				int *destp;
				int flagtemp;
				BYTE val = 0;	// quiet, GCC
				bool found;

				if (arg->ArgNum < 4)
				{
					destp = &ld->args[arg->ArgNum+1];
				}
				else
				{
					flagtemp = ((flags >> 9) & 0x3f);
					destp = &flagtemp;
				}
				if (arg->ListSize == 0)
				{
					val = arg->ConstantValue;
					found = true;
				}
				else
				{
					found = false;
					for (int k = 0; k < arg->ListSize; k++)
					{
						if ((special & arg->AndValue) == arg->ResultFilter[k])
						{
							val = arg->ResultValue[k];
							found = true;
						}
					}
				}
				if (found)
				{
					if (arg->bOrExisting)
					{
						*destp |= val;
					}
					else
					{
						*destp = val;
					}
					if (arg->ArgNum == 4)
					{
						flags = (flags & ~0x7e00) | (flagtemp << 9);
					}
				}
			}
			// We treat push triggers like switch triggers with zero tags.
			if ((special & 7) == PushMany || (special & 7) == PushOnce)
			{
				if (ld->special == Generic_Door)
				{
					ld->args[2] |= 128;
				}
				else
				{
					ld->args[0] = 0;
				}
			}
			ld->flags = flags;
			if (flags & ML_MONSTERSCANACTIVATE && ld->activation == SPAC_Cross)
			{
				// In Boom anything can activate such a line so set the proper type here.
				ld->activation = SPAC_AnyCross;
			}
			return;
		}
	}
	// Don't know what to do, so 0 it
	ld->special = 0;
	ld->flags = flags;
	memset (ld->args, 0, sizeof(ld->args));
}